

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

stage * __thiscall
mpt::unique_array<mpt::cycle::stage>::get(unique_array<mpt::cycle::stage> *this,long pos)

{
  long lVar1;
  iterator psVar2;
  long local_20;
  long pos_local;
  unique_array<mpt::cycle::stage> *this_local;
  
  if (pos < 0) {
    local_20 = length(this);
    local_20 = local_20 + pos;
    if (local_20 < 0) {
      return (stage *)0x0;
    }
  }
  else {
    lVar1 = length(this);
    local_20 = pos;
    if (lVar1 <= pos) {
      return (stage *)0x0;
    }
  }
  psVar2 = begin(this);
  return psVar2 + local_20;
}

Assistant:

T *get(long pos) const
	{
		if (pos < 0) {
			if ((pos += length()) < 0) {
				return 0;
			}
		}
		else if (pos >= length()) {
			return 0;
		}
		return begin() + pos;
	}